

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

void Mpm_ObjRecycleCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  Mmr_Step_t *pMVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  uint Entry;
  ulong uVar9;
  
  uVar4 = (uint)pObj->pFans[3] >> 1;
  if ((p->vCutLists).nSize <= (int)uVar4) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar4 = (p->vCutLists).pArray[uVar4];
  while (uVar4 != 0) {
    pMVar3 = p->pManCuts;
    uVar5 = pMVar3->uMask & uVar4;
    if ((int)uVar5 < 1) {
      __assert_fail("(h & p->uMask) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                    ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
    }
    Entry = (int)uVar4 >> ((byte)pMVar3->nBits & 0x1f);
    if ((int)Entry < 1) {
LAB_0047e83d:
      __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                    ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
    }
    uVar8 = (ulong)uVar5;
    iVar2 = *(int *)((long)pMVar3 + uVar8 * 0x38 + 0x34);
    bVar7 = (byte)*(undefined4 *)((long)pMVar3 + uVar8 * 0x38 + 0x18);
    if (iVar2 << (bVar7 & 0x1f) <= (int)Entry) goto LAB_0047e83d;
    bVar7 = bVar7 & 0x1f;
    uVar4 = Entry >> bVar7;
    if (((int)(Entry >> bVar7) < 0) || (iVar2 <= (int)uVar4)) {
LAB_0047e85c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    lVar6 = *(long *)(*(long *)((long)pMVar3 + uVar8 * 0x38 + 0x38) + (ulong)uVar4 * 8);
    uVar9 = (ulong)(*(uint *)((long)pMVar3 + uVar8 * 0x38 + 0x1c) & Entry);
    if ((*(uint *)(lVar6 + 4 + uVar9 * 8) >> 0x19) + 0xc >> 3 != uVar5) {
      __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                    ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
    }
    if (lVar6 == 0) break;
    uVar4 = *(uint *)(lVar6 + uVar9 * 8);
    pMVar3->nEntries = pMVar3->nEntries + -1;
    lVar6 = uVar8 * 0x38;
    piVar1 = (int *)((long)pMVar3 + lVar6 + 0x24);
    *piVar1 = *piVar1 + -1;
    iVar2 = *(int *)((long)pMVar3 + lVar6 + 0x34);
    bVar7 = (byte)*(undefined4 *)((long)pMVar3 + lVar6 + 0x18);
    if (iVar2 << (bVar7 & 0x1f) <= (int)Entry) goto LAB_0047e83d;
    bVar7 = bVar7 & 0x1f;
    uVar5 = Entry >> bVar7;
    if (((int)(Entry >> bVar7) < 0) || (iVar2 <= (int)uVar5)) goto LAB_0047e85c;
    memset((void *)((ulong)(*(uint *)((long)pMVar3 + lVar6 + 0x1c) & Entry) * 8 +
                   *(long *)(*(long *)((long)pMVar3 + lVar6 + 0x38) + (ulong)uVar5 * 8)),0xff,
           (long)*(int *)((long)pMVar3 + lVar6 + 0x20) << 3);
    Vec_IntPush((Vec_Int_t *)((long)pMVar3 + lVar6 + 0x40),Entry);
  }
  uVar4 = (uint)pObj->pFans[3] >> 1;
  if ((p->vCutLists).nSize <= (int)uVar4) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vCutLists).pArray[uVar4] = 0;
  return;
}

Assistant:

static inline void Mpm_ObjRecycleCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext;
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
        Mmr_StepRecycle( p->pManCuts, hCut );
    Mpm_ObjSetCutList( p, pObj, 0 );
}